

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

rotation_t *
opengv::relative_pose::rotationOnly
          (rotation_t *__return_storage_ptr__,RelativeAdapterBase *adapter,Indices *indices)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  int iVar5;
  size_t i;
  size_t sVar6;
  undefined1 in_ZMM0 [64];
  MatrixXd Hcross;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *local_c0;
  Vector3d *local_b8;
  Vector3d f;
  Vector3d pointsCenter2;
  Vector3d pointsCenter1;
  Vector3d fprime;
  undefined1 local_48 [24];
  
  sVar1 = indices->_numberCorrespondences;
  Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&pointsCenter1,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&Hcross);
  Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&pointsCenter2,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&Hcross);
  lVar4 = 0;
  for (sVar6 = 0; sVar1 != sVar6; sVar6 = sVar6 + 1) {
    iVar5 = (int)sVar6;
    iVar3 = iVar5;
    if (indices->_useIndices != false) {
      iVar3 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + (lVar4 >> 0x1e));
    }
    (*adapter->_vptr_RelativeAdapterBase[2])
              ((DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&Hcross,adapter,(long)iVar3);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&pointsCenter1,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&Hcross);
    if (indices->_useIndices != false) {
      iVar5 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + (lVar4 >> 0x1e));
    }
    (*adapter->_vptr_RelativeAdapterBase[3])
              ((DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&Hcross,adapter,(long)iVar5);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&pointsCenter2,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&Hcross);
    lVar4 = lVar4 + 0x100000000;
  }
  auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,sVar1);
  Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&pointsCenter1;
  Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       auVar2._0_8_;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)&Hcross);
  Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&pointsCenter2;
  Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       auVar2._0_8_;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)&Hcross);
  f.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]._0_4_ = 3
  ;
  fprime.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)CONCAT44(fprime.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[0]._4_4_,3);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&Hcross,(int *)&f,(int *)&fprime);
  f.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 0.0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&Hcross,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
              *)&f);
  lVar4 = 0;
  for (sVar6 = 0; sVar1 != sVar6; sVar6 = sVar6 + 1) {
    iVar5 = (int)sVar6;
    iVar3 = iVar5;
    if (indices->_useIndices != false) {
      iVar3 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + (lVar4 >> 0x1e));
    }
    (*adapter->_vptr_RelativeAdapterBase[2])
              ((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_c0,adapter,(long)iVar3);
    fprime.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         (double)&pointsCenter1;
    fprime.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         (double)&local_c0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&f,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&fprime);
    if (indices->_useIndices != false) {
      iVar5 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + (lVar4 >> 0x1e));
    }
    (*adapter->_vptr_RelativeAdapterBase[3])(local_48,adapter,(long)iVar5);
    local_b8 = &pointsCenter2;
    local_c0 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_48;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&fprime,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_c0);
    local_b8 = &f;
    local_c0 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&fprime;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&Hcross,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)&local_c0);
    lVar4 = lVar4 + 0x100000000;
  }
  math::arun(__return_storage_ptr__,&Hcross);
  Eigen::internal::handmade_aligned_free
            (Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
  return __return_storage_ptr__;
}

Assistant:

rotation_t rotationOnly(
    const RelativeAdapterBase & adapter,
    const Indices & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 2);

  Eigen::Vector3d pointsCenter1 = Eigen::Vector3d::Zero();
  Eigen::Vector3d pointsCenter2 = Eigen::Vector3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    pointsCenter1 += adapter.getBearingVector1(indices[i]);
    pointsCenter2 += adapter.getBearingVector2(indices[i]);
  }

  pointsCenter1 = pointsCenter1 / numberCorrespondences;
  pointsCenter2 = pointsCenter2 / numberCorrespondences;

  Eigen::MatrixXd Hcross(3,3);
  Hcross = Eigen::Matrix3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    Eigen::Vector3d f = adapter.getBearingVector1(indices[i]) - pointsCenter1;
    Eigen::Vector3d fprime =
        adapter.getBearingVector2(indices[i]) - pointsCenter2;
    Hcross += fprime * f.transpose();
  }

  return math::arun(Hcross);
}